

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_decompress.cpp
# Opt level: O2

void duckdb_zstd::HUF_decompress4X2_usingDTable_internal_fast_c_loop(HUF_DecompressFastArgs *args)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  void *pvVar6;
  uint uVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  U64 UVar12;
  ulong uVar13;
  ulong uVar14;
  ulong *puVar15;
  BYTE *pBVar16;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  ulong uVar20;
  ulong uVar21;
  ulong *puVar22;
  ulong uVar23;
  ulong uVar24;
  ulong *puVar25;
  ulong uVar26;
  U64 UVar27;
  BYTE *local_d8;
  U64 local_d0;
  BYTE *local_c8;
  BYTE *local_c0;
  U64 local_a8;
  ulong *local_a0;
  BYTE *local_98 [4];
  BYTE **local_78;
  HUF_DecompressFastArgs *local_70;
  BYTE *local_68;
  BYTE *local_60;
  BYTE *local_58 [5];
  
  pvVar6 = args->dt;
  local_68 = args->ilowest;
  UVar12 = args->bits[0];
  UVar27 = args->bits[1];
  local_d0 = args->bits[2];
  local_a8 = args->bits[3];
  local_a0 = (ulong *)args->ip[0];
  puVar15 = (ulong *)args->ip[1];
  puVar25 = (ulong *)args->ip[2];
  puVar22 = (ulong *)args->ip[3];
  local_78 = args->op;
  local_d8 = args->op[0];
  local_c8 = args->op[1];
  local_98[0] = local_d8;
  local_98[1] = local_c8;
  local_c0 = args->op[2];
  local_98[3] = args->op[3];
  local_98[2] = local_c0;
  local_70 = args;
  local_58[2] = local_98[3];
  local_58[3] = args->oend;
  local_58[0] = local_c8;
  local_58[1] = local_c0;
  while( true ) {
    uVar10 = (ulong)((long)local_a0 - (long)local_68) / 7;
    for (lVar19 = 0; lVar19 != 4; lVar19 = lVar19 + 1) {
      uVar11 = (ulong)((long)local_58[lVar19] - (long)local_98[lVar19]) / 10;
      if (uVar11 <= uVar10) {
        uVar10 = uVar11;
      }
    }
    if ((((uVar10 == 0) || (puVar15 < local_a0)) || (puVar25 < puVar15)) || (puVar22 < puVar25))
    break;
    local_60 = local_98[3] + uVar10 * 5;
    pBVar16 = local_c0;
    do {
      uVar10 = UVar12 >> 0x35;
      bVar1 = *(byte *)((long)pvVar6 + uVar10 * 4 + 2);
      uVar18 = (ulong)*(byte *)((long)pvVar6 + uVar10 * 4 + 3);
      *(undefined2 *)local_d8 = *(undefined2 *)((long)pvVar6 + uVar10 * 4);
      uVar11 = UVar27 >> 0x35;
      uVar10 = UVar12 << ((ulong)bVar1 & 0x3f);
      bVar1 = *(byte *)((long)pvVar6 + uVar11 * 4 + 2);
      uVar17 = (ulong)*(byte *)((long)pvVar6 + uVar11 * 4 + 3);
      *(undefined2 *)local_c8 = *(undefined2 *)((long)pvVar6 + uVar11 * 4);
      uVar11 = local_d0 >> 0x35;
      bVar2 = *(byte *)((long)pvVar6 + uVar11 * 4 + 2);
      uVar20 = (ulong)*(byte *)((long)pvVar6 + uVar11 * 4 + 3);
      uVar13 = uVar10 >> 0x35;
      *(undefined2 *)pBVar16 = *(undefined2 *)((long)pvVar6 + uVar11 * 4);
      bVar3 = *(byte *)((long)pvVar6 + uVar13 * 4 + 2);
      uVar23 = (ulong)*(byte *)((long)pvVar6 + uVar13 * 4 + 3);
      *(undefined2 *)(local_d8 + uVar18) = *(undefined2 *)((long)pvVar6 + uVar13 * 4);
      uVar11 = UVar27 << ((ulong)bVar1 & 0x3f);
      uVar13 = local_d0 << ((ulong)bVar2 & 0x3f);
      uVar26 = uVar11 >> 0x35;
      bVar1 = *(byte *)((long)pvVar6 + uVar26 * 4 + 2);
      uVar24 = (ulong)*(byte *)((long)pvVar6 + uVar26 * 4 + 3);
      *(undefined2 *)(local_c8 + uVar17) = *(undefined2 *)((long)pvVar6 + uVar26 * 4);
      uVar26 = uVar13 >> 0x35;
      bVar2 = *(byte *)((long)pvVar6 + uVar26 * 4 + 2);
      uVar14 = (ulong)*(byte *)((long)pvVar6 + uVar26 * 4 + 3);
      *(undefined2 *)(pBVar16 + uVar20) = *(undefined2 *)((long)pvVar6 + uVar26 * 4);
      uVar10 = uVar10 << ((ulong)bVar3 & 0x3f);
      uVar11 = uVar11 << ((ulong)bVar1 & 0x3f);
      uVar26 = uVar10 >> 0x35;
      bVar1 = *(byte *)((long)pvVar6 + uVar26 * 4 + 2);
      uVar21 = (ulong)*(byte *)((long)pvVar6 + uVar26 * 4 + 3);
      *(undefined2 *)(local_d8 + uVar23 + uVar18) = *(undefined2 *)((long)pvVar6 + uVar26 * 4);
      uVar26 = uVar11 >> 0x35;
      lVar19 = uVar23 + uVar18;
      bVar3 = *(byte *)((long)pvVar6 + uVar26 * 4 + 2);
      uVar18 = (ulong)*(byte *)((long)pvVar6 + uVar26 * 4 + 3);
      *(undefined2 *)(local_c8 + uVar24 + uVar17) = *(undefined2 *)((long)pvVar6 + uVar26 * 4);
      lVar8 = uVar24 + uVar17;
      uVar13 = uVar13 << ((ulong)bVar2 & 0x3f);
      uVar10 = uVar10 << ((ulong)bVar1 & 0x3f);
      uVar26 = uVar13 >> 0x35;
      bVar1 = *(byte *)((long)pvVar6 + uVar26 * 4 + 2);
      uVar17 = (ulong)*(byte *)((long)pvVar6 + uVar26 * 4 + 3);
      *(undefined2 *)(pBVar16 + uVar14 + uVar20) = *(undefined2 *)((long)pvVar6 + uVar26 * 4);
      uVar26 = uVar10 >> 0x35;
      lVar9 = uVar14 + uVar20;
      bVar2 = *(byte *)((long)pvVar6 + uVar26 * 4 + 2);
      uVar23 = (ulong)*(byte *)((long)pvVar6 + uVar26 * 4 + 3);
      *(undefined2 *)(local_d8 + uVar21 + lVar19) = *(undefined2 *)((long)pvVar6 + uVar26 * 4);
      lVar19 = uVar21 + lVar19;
      uVar11 = uVar11 << ((ulong)bVar3 & 0x3f);
      uVar13 = uVar13 << ((ulong)bVar1 & 0x3f);
      uVar26 = uVar11 >> 0x35;
      bVar1 = *(byte *)((long)pvVar6 + uVar26 * 4 + 2);
      uVar14 = (ulong)*(byte *)((long)pvVar6 + uVar26 * 4 + 3);
      *(undefined2 *)(local_c8 + uVar18 + lVar8) = *(undefined2 *)((long)pvVar6 + uVar26 * 4);
      uVar26 = uVar13 >> 0x35;
      lVar8 = uVar18 + lVar8;
      bVar3 = *(byte *)((long)pvVar6 + uVar26 * 4 + 2);
      uVar18 = (ulong)*(byte *)((long)pvVar6 + uVar26 * 4 + 3);
      *(undefined2 *)(pBVar16 + uVar17 + lVar9) = *(undefined2 *)((long)pvVar6 + uVar26 * 4);
      lVar9 = uVar17 + lVar9;
      uVar10 = uVar10 << ((ulong)bVar2 & 0x3f);
      uVar11 = uVar11 << ((ulong)bVar1 & 0x3f);
      uVar26 = uVar10 >> 0x35;
      bVar1 = *(byte *)((long)pvVar6 + uVar26 * 4 + 2);
      bVar2 = *(byte *)((long)pvVar6 + uVar26 * 4 + 3);
      *(undefined2 *)(local_d8 + uVar23 + lVar19) = *(undefined2 *)((long)pvVar6 + uVar26 * 4);
      uVar26 = uVar11 >> 0x35;
      bVar4 = *(byte *)((long)pvVar6 + uVar26 * 4 + 2);
      bVar5 = *(byte *)((long)pvVar6 + uVar26 * 4 + 3);
      *(undefined2 *)(local_c8 + uVar14 + lVar8) = *(undefined2 *)((long)pvVar6 + uVar26 * 4);
      uVar13 = uVar13 << ((ulong)bVar3 & 0x3f);
      local_d8 = local_d8 + (ulong)bVar2 + uVar23 + lVar19;
      local_c8 = local_c8 + (ulong)bVar5 + uVar14 + lVar8;
      uVar11 = uVar11 << ((ulong)bVar4 & 0x3f);
      uVar26 = uVar13 >> 0x35;
      bVar2 = *(byte *)((long)pvVar6 + uVar26 * 4 + 2);
      local_c0 = pBVar16 + (ulong)*(byte *)((long)pvVar6 + uVar26 * 4 + 3) + uVar18 + lVar9;
      *(undefined2 *)(pBVar16 + uVar18 + lVar9) = *(undefined2 *)((long)pvVar6 + uVar26 * 4);
      uVar13 = uVar13 << ((ulong)bVar2 & 0x3f);
      uVar18 = local_a8 >> 0x35;
      bVar2 = *(byte *)((long)pvVar6 + uVar18 * 4 + 2);
      uVar26 = (ulong)*(byte *)((long)pvVar6 + uVar18 * 4 + 3);
      *(undefined2 *)local_98[3] = *(undefined2 *)((long)pvVar6 + uVar18 * 4);
      uVar18 = local_a8 << ((ulong)bVar2 & 0x3f);
      uVar23 = uVar18 >> 0x35;
      bVar2 = *(byte *)((long)pvVar6 + uVar23 * 4 + 2);
      uVar14 = (ulong)*(byte *)((long)pvVar6 + uVar23 * 4 + 3);
      *(undefined2 *)(local_98[3] + uVar26) = *(undefined2 *)((long)pvVar6 + uVar23 * 4);
      uVar18 = uVar18 << ((ulong)bVar2 & 0x3f);
      uVar7 = 0;
      for (uVar10 = uVar10 << ((ulong)bVar1 & 0x3f); (uVar10 & 1) == 0;
          uVar10 = uVar10 >> 1 | 0x8000000000000000) {
        uVar7 = uVar7 + 1;
      }
      lVar19 = uVar14 + uVar26;
      local_a0 = (ulong *)((long)local_a0 - (ulong)(uVar7 >> 3));
      UVar12 = (*local_a0 | 1) << ((byte)uVar7 & 7);
      uVar23 = uVar18 >> 0x35;
      bVar1 = *(byte *)((long)pvVar6 + uVar23 * 4 + 2);
      uVar10 = (ulong)*(byte *)((long)pvVar6 + uVar23 * 4 + 3);
      *(undefined2 *)(local_98[3] + uVar14 + uVar26) = *(undefined2 *)((long)pvVar6 + uVar23 * 4);
      uVar18 = uVar18 << ((ulong)bVar1 & 0x3f);
      uVar7 = 0;
      for (; (uVar11 & 1) == 0; uVar11 = uVar11 >> 1 | 0x8000000000000000) {
        uVar7 = uVar7 + 1;
      }
      lVar8 = uVar10 + lVar19;
      puVar15 = (ulong *)((long)puVar15 - (ulong)(uVar7 >> 3));
      UVar27 = (*puVar15 | 1) << ((byte)uVar7 & 7);
      uVar11 = uVar18 >> 0x35;
      uVar26 = (ulong)*(byte *)((long)pvVar6 + uVar11 * 4 + 3);
      uVar18 = uVar18 << ((ulong)*(byte *)((long)pvVar6 + uVar11 * 4 + 2) & 0x3f);
      uVar7 = 0;
      for (; (uVar13 & 1) == 0; uVar13 = uVar13 >> 1 | 0x8000000000000000) {
        uVar7 = uVar7 + 1;
      }
      *(undefined2 *)(local_98[3] + uVar10 + lVar19) = *(undefined2 *)((long)pvVar6 + uVar11 * 4);
      puVar25 = (ulong *)((long)puVar25 - (ulong)(uVar7 >> 3));
      uVar10 = *puVar25;
      uVar11 = uVar18 >> 0x35;
      bVar1 = *(byte *)((long)pvVar6 + uVar11 * 4 + 2);
      bVar2 = *(byte *)((long)pvVar6 + uVar11 * 4 + 3);
      *(undefined2 *)(local_98[3] + uVar26 + lVar8) = *(undefined2 *)((long)pvVar6 + uVar11 * 4);
      local_d0 = (uVar10 | 1) << ((byte)uVar7 & 7);
      uVar7 = 0;
      for (uVar18 = uVar18 << ((ulong)bVar1 & 0x3f); (uVar18 & 1) == 0;
          uVar18 = uVar18 >> 1 | 0x8000000000000000) {
        uVar7 = uVar7 + 1;
      }
      local_98[3] = local_98[3] + (ulong)bVar2 + uVar26 + lVar8;
      puVar22 = (ulong *)((long)puVar22 - (ulong)(uVar7 >> 3));
      local_a8 = (*puVar22 | 1) << ((byte)uVar7 & 7);
      pBVar16 = local_c0;
    } while (local_98[3] < local_60);
    local_98[0] = local_d8;
    local_98[1] = local_c8;
    local_98[2] = local_c0;
  }
  args->bits[0] = UVar12;
  args->bits[1] = UVar27;
  args->bits[2] = local_d0;
  args->bits[3] = local_a8;
  args->ip[0] = (BYTE *)local_a0;
  args->ip[1] = (BYTE *)puVar15;
  args->ip[2] = (BYTE *)puVar25;
  args->ip[3] = (BYTE *)puVar22;
  args->op[2] = local_c0;
  args->op[3] = local_98[3];
  args->op[0] = local_d8;
  args->op[1] = local_c8;
  return;
}

Assistant:

static HUF_FAST_BMI2_ATTRS
void HUF_decompress4X2_usingDTable_internal_fast_c_loop(HUF_DecompressFastArgs* args)
{
    U64 bits[4];
    BYTE const* ip[4];
    BYTE* op[4];
    BYTE* oend[4];
    HUF_DEltX2 const* const dtable = (HUF_DEltX2 const*)args->dt;
    BYTE const* const ilowest = args->ilowest;

    /* Copy the arguments to local registers. */
    ZSTD_memcpy(&bits, &args->bits, sizeof(bits));
    ZSTD_memcpy((void*)(&ip), &args->ip, sizeof(ip));
    ZSTD_memcpy(&op, &args->op, sizeof(op));

    oend[0] = op[1];
    oend[1] = op[2];
    oend[2] = op[3];
    oend[3] = args->oend;

    assert(MEM_isLittleEndian());
    assert(!MEM_32bits());

    for (;;) {
        BYTE* olimit;
        int stream;

        /* Assert loop preconditions */
#ifndef NDEBUG
        for (stream = 0; stream < 4; ++stream) {
            assert(op[stream] <= oend[stream]);
            assert(ip[stream] >= ilowest);
        }
#endif
        /* Compute olimit */
        {
            /* Each loop does 5 table lookups for each of the 4 streams.
             * Each table lookup consumes up to 11 bits of input, and produces
             * up to 2 bytes of output.
             */
            /* We can consume up to 7 bytes of input per iteration per stream.
             * We also know that each input pointer is >= ip[0]. So we can run
             * iters loops before running out of input.
             */
            size_t iters = (size_t)(ip[0] - ilowest) / 7;
            /* Each iteration can produce up to 10 bytes of output per stream.
             * Each output stream my advance at different rates. So take the
             * minimum number of safe iterations among all the output streams.
             */
            for (stream = 0; stream < 4; ++stream) {
                size_t const oiters = (size_t)(oend[stream] - op[stream]) / 10;
                iters = MIN(iters, oiters);
            }

            /* Each iteration produces at least 5 output symbols. So until
             * op[3] crosses olimit, we know we haven't executed iters
             * iterations yet. This saves us maintaining an iters counter,
             * at the expense of computing the remaining # of iterations
             * more frequently.
             */
            olimit = op[3] + (iters * 5);

            /* Exit the fast decoding loop once we reach the end. */
            if (op[3] == olimit)
                break;

            /* Exit the decoding loop if any input pointer has crossed the
             * previous one. This indicates corruption, and a precondition
             * to our loop is that ip[i] >= ip[0].
             */
            for (stream = 1; stream < 4; ++stream) {
                if (ip[stream] < ip[stream - 1])
                    goto _out;
            }
        }

#ifndef NDEBUG
        for (stream = 1; stream < 4; ++stream) {
            assert(ip[stream] >= ip[stream - 1]);
        }
#endif

#define HUF_4X2_DECODE_SYMBOL(_stream, _decode3)                      \
    do {                                                              \
        if ((_decode3) || (_stream) != 3) {                           \
            int const index = (int)(bits[(_stream)] >> 53);           \
            HUF_DEltX2 const entry = dtable[index];                   \
            MEM_write16(op[(_stream)], entry.sequence); \
            bits[(_stream)] <<= (entry.nbBits) & 0x3F;                \
            op[(_stream)] += (entry.length);                          \
        }                                                             \
    } while (0)

#define HUF_4X2_RELOAD_STREAM(_stream)                                  \
    do {                                                                \
        HUF_4X2_DECODE_SYMBOL(3, 1);                                    \
        {                                                               \
            int const ctz = ZSTD_countTrailingZeros64(bits[(_stream)]); \
            int const nbBits = ctz & 7;                                 \
            int const nbBytes = ctz >> 3;                               \
            ip[(_stream)] -= nbBytes;                                   \
            bits[(_stream)] = MEM_read64(ip[(_stream)]) | 1;            \
            bits[(_stream)] <<= nbBits;                                 \
        }                                                               \
    } while (0)

        /* Manually unroll the loop because compilers don't consistently
         * unroll the inner loops, which destroys performance.
         */
        do {
            /* Decode 5 symbols from each of the first 3 streams.
             * The final stream will be decoded during the reload phase
             * to reduce register pressure.
             */
            HUF_4X_FOR_EACH_STREAM_WITH_VAR(HUF_4X2_DECODE_SYMBOL, 0);
            HUF_4X_FOR_EACH_STREAM_WITH_VAR(HUF_4X2_DECODE_SYMBOL, 0);
            HUF_4X_FOR_EACH_STREAM_WITH_VAR(HUF_4X2_DECODE_SYMBOL, 0);
            HUF_4X_FOR_EACH_STREAM_WITH_VAR(HUF_4X2_DECODE_SYMBOL, 0);
            HUF_4X_FOR_EACH_STREAM_WITH_VAR(HUF_4X2_DECODE_SYMBOL, 0);

            /* Decode one symbol from the final stream */
            HUF_4X2_DECODE_SYMBOL(3, 1);

            /* Decode 4 symbols from the final stream & reload bitstreams.
             * The final stream is reloaded last, meaning that all 5 symbols
             * are decoded from the final stream before it is reloaded.
             */
            HUF_4X_FOR_EACH_STREAM(HUF_4X2_RELOAD_STREAM);
        } while (op[3] < olimit);
    }

#undef HUF_4X2_DECODE_SYMBOL
#undef HUF_4X2_RELOAD_STREAM

_out:

    /* Save the final values of each of the state variables back to args. */
    ZSTD_memcpy(&args->bits, &bits, sizeof(bits));
    ZSTD_memcpy((void*)(&args->ip), &ip, sizeof(ip));
    ZSTD_memcpy(&args->op, &op, sizeof(op));
}